

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractPosition
          (ValueExtractor *this,int *left,int *top,int *right,int *bottom,Origin *origin,
          Alignment *position,PositionMode *mode,Alignment *textAlignment)

{
  Property PVar1;
  bool bVar2;
  QFlagsStorage<Qt::AlignmentFlag> QVar3;
  int iVar4;
  Alignment *pAVar5;
  long lVar6;
  Declaration *pDVar7;
  int i;
  ulong uVar8;
  
  extractFont(this);
  lVar6 = 0;
  uVar8 = 0;
  bVar2 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar8) {
      return bVar2;
    }
    pDVar7 = (this->declarations).d.ptr;
    PVar1 = (pDVar7[uVar8].d.d.ptr)->propertyId;
    if (0xc < PVar1 - Left) goto switchD_0053ed11_caseD_53;
    pDVar7 = (Declaration *)((long)&(pDVar7->d).d.ptr + lVar6);
    switch(PVar1) {
    case Left:
      iVar4 = lengthValue(this,pDVar7);
      *left = iVar4;
      goto LAB_0053ed89;
    case Right:
      QVar3.i = lengthValue(this,pDVar7);
      pAVar5 = (Alignment *)right;
      break;
    case Top:
      iVar4 = lengthValue(this,pDVar7);
      *top = iVar4;
      goto LAB_0053ed89;
    case Bottom:
      QVar3.i = lengthValue(this,pDVar7);
      pAVar5 = (Alignment *)bottom;
      break;
    case QtOrigin:
      QVar3.i = Declaration::originValue(pDVar7);
      pAVar5 = (Alignment *)origin;
      break;
    case QtPosition:
      QVar3.i = (Int)Declaration::alignmentValue(pDVar7);
      pAVar5 = position;
      break;
    case Position:
      QVar3.i = Declaration::positionValue(pDVar7);
      pAVar5 = (Alignment *)mode;
      break;
    default:
      goto switchD_0053ed11_caseD_53;
    case TextAlignment:
      QVar3.i = (Int)Declaration::alignmentValue(pDVar7);
      pAVar5 = textAlignment;
    }
    (pAVar5->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>
    .i = QVar3.i;
LAB_0053ed89:
    bVar2 = true;
switchD_0053ed11_caseD_53:
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

bool ValueExtractor::extractPosition(int *left, int *top, int *right, int *bottom, QCss::Origin *origin,
                                     Qt::Alignment *position, QCss::PositionMode *mode, Qt::Alignment *textAlignment)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Left: *left = lengthValue(decl); break;
        case Top: *top = lengthValue(decl); break;
        case Right: *right = lengthValue(decl); break;
        case Bottom: *bottom = lengthValue(decl); break;
        case QtOrigin: *origin = decl.originValue(); break;
        case QtPosition: *position = decl.alignmentValue(); break;
        case TextAlignment: *textAlignment = decl.alignmentValue(); break;
        case Position: *mode = decl.positionValue(); break;
        default: continue;
        }
        hit = true;
    }

    return hit;
}